

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::VariableWrite::VariableWrite
          (VariableWrite *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  IsWritableSupersetEntry filter;
  IsWritableSupersetEntry filter_00;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableSupersetEntry> first_00;
  ValueRangeAccess valueRange_00;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableSupersetEntry> last;
  Scalar *state_00;
  bool bVar1;
  VariableManager *pVVar2;
  VariableType *pVVar3;
  Variable *pVVar4;
  Random *pRVar5;
  ValueEntry *pVVar6;
  Scalar *in_stack_fffffffffffffcd0;
  bool local_274;
  bool local_272;
  ValueRangeAccess local_240;
  VariableType *local_228;
  Scalar *pSStack_220;
  Scalar *local_218;
  ValueRangeAccess local_210;
  undefined1 local_1f8 [8];
  ValueRange infRange;
  undefined8 uStack_170;
  Scalar *local_168;
  ValueEntry *parentEntry;
  ValueEntry *entry;
  bool createVar;
  float createOnAssignWeight;
  IsWritableSupersetEntry local_c8;
  undefined1 auStack_b0 [8];
  Iterator end;
  IsWritableSupersetEntry local_68;
  undefined1 auStack_40 [8];
  Iterator first;
  GeneratorState *state_local;
  VariableWrite *this_local;
  
  first.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
  .m_filter.m_valueRange.m_max = (Scalar *)state;
  VariableAccess::VariableAccess(&this->super_VariableAccess);
  (this->super_VariableAccess).super_Expression._vptr_Expression =
       (_func_int **)&PTR__VariableWrite_0025ae60;
  pVVar2 = GeneratorState::getVariableManager
                     ((GeneratorState *)
                      first.
                      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                      .m_filter.m_valueRange.m_max);
  end.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
  .m_filter.m_valueRange.m_max = (Scalar *)valueRange.m_type;
  anon_unknown_0::IsWritableSupersetEntry::IsWritableSupersetEntry(&local_68,valueRange);
  filter.m_valueRange.m_min = local_68.m_valueRange.m_min;
  filter.m_valueRange.m_type = local_68.m_valueRange.m_type;
  filter.m_valueRange.m_max = local_68.m_valueRange.m_max;
  VariableManager::getBegin<rsg::(anonymous_namespace)::IsWritableSupersetEntry>
            ((ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableSupersetEntry> *)auStack_40,
             pVVar2,filter);
  pVVar2 = GeneratorState::getVariableManager
                     ((GeneratorState *)
                      first.
                      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                      .m_filter.m_valueRange.m_max);
  anon_unknown_0::IsWritableSupersetEntry::IsWritableSupersetEntry(&local_c8,valueRange);
  filter_00.m_valueRange.m_min = local_c8.m_valueRange.m_min;
  filter_00.m_valueRange.m_type = local_c8.m_valueRange.m_type;
  filter_00.m_valueRange.m_max = local_c8.m_valueRange.m_max;
  VariableManager::getEnd<rsg::(anonymous_namespace)::IsWritableSupersetEntry>
            ((ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableSupersetEntry> *)auStack_b0,
             pVVar2,filter_00);
  state_00 = first.
             super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
             .m_filter.m_valueRange.m_max;
  pVVar3 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = anon_unknown_0::canAllocateVariable((GeneratorState *)state_00,pVVar3);
  local_272 = false;
  if (bVar1) {
    bVar1 = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
            ::operator==((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                          *)auStack_40,
                         (FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                          *)auStack_b0);
    local_274 = true;
    if (!bVar1) {
      pRVar5 = GeneratorState::getRandom
                         ((GeneratorState *)
                          first.
                          super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                          .m_filter.m_valueRange.m_max);
      local_274 = anon_unknown_0::getWeightedBool(pRVar5,0.1);
    }
    local_272 = local_274;
  }
  if (local_272 == false) {
    pRVar5 = GeneratorState::getRandom
                       ((GeneratorState *)
                        first.
                        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                        .m_filter.m_valueRange.m_max);
    first_00.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_end._M_current =
         first.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_iter._M_current;
    first_00.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_iter._M_current = (ValueEntry **)auStack_40;
    first_00.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_filter.m_valueRange.m_type =
         (VariableType *)
         first.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_end._M_current;
    first_00.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_filter.m_valueRange.m_min =
         (Scalar *)
         first.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_filter.m_valueRange.m_type;
    first_00.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_filter.m_valueRange.m_max =
         first.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_filter.m_valueRange.m_min;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_end._M_current =
         end.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_iter._M_current;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_iter._M_current = (ValueEntry **)auStack_b0;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_filter.m_valueRange.m_type =
         (VariableType *)
         end.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_end._M_current;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_filter.m_valueRange.m_min =
         (Scalar *)
         end.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_filter.m_valueRange.m_type;
    last.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
    .m_filter.m_valueRange.m_max =
         end.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_filter.m_valueRange.m_min;
    pVVar6 = de::Random::
             choose<rsg::ValueEntry_const*,rsg::ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableSupersetEntry>>
                       (pRVar5,first_00,last);
    pVVar4 = ValueEntry::getVariable(pVVar6);
    (this->super_VariableAccess).m_variable = pVVar4;
    in_stack_fffffffffffffcd0 =
         (Scalar *)
         first.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
         .m_filter.m_valueRange.m_type;
  }
  else {
    pVVar2 = GeneratorState::getVariableManager
                       ((GeneratorState *)
                        first.
                        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                        .m_filter.m_valueRange.m_max);
    pVVar3 = ConstValueRangeAccess::getType(&valueRange);
    pVVar4 = VariableManager::allocate(pVVar2,pVVar3);
    (this->super_VariableAccess).m_variable = pVVar4;
  }
  pVVar2 = GeneratorState::getVariableManager
                     ((GeneratorState *)
                      first.
                      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                      .m_filter.m_valueRange.m_max);
  pVVar6 = VariableManager::getParentValue(pVVar2,(this->super_VariableAccess).m_variable);
  if (pVVar6 == (ValueEntry *)0x0) {
    pVVar3 = Variable::getType((this->super_VariableAccess).m_variable);
    ValueRange::ValueRange((ValueRange *)local_1f8,pVVar3);
    ValueRange::operator_cast_to_ValueRangeAccess(&local_210,(ValueRange *)local_1f8);
    valueRange_00.super_ConstValueRangeAccess.m_min = local_210.super_ConstValueRangeAccess.m_max;
    valueRange_00.super_ConstValueRangeAccess.m_type =
         (VariableType *)local_210.super_ConstValueRangeAccess.m_min;
    valueRange_00.super_ConstValueRangeAccess.m_max = in_stack_fffffffffffffcd0;
    anon_unknown_0::setInfiniteRange(valueRange_00);
    pVVar2 = GeneratorState::getVariableManager
                       ((GeneratorState *)
                        first.
                        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                        .m_filter.m_valueRange.m_max);
    pVVar4 = (this->super_VariableAccess).m_variable;
    ValueRange::asAccess(&local_240,(ValueRange *)local_1f8);
    local_218 = local_240.super_ConstValueRangeAccess.m_max;
    local_228 = local_240.super_ConstValueRangeAccess.m_type;
    pSStack_220 = local_240.super_ConstValueRangeAccess.m_min;
    value_00.m_min = local_240.super_ConstValueRangeAccess.m_min;
    value_00.m_type = local_240.super_ConstValueRangeAccess.m_type;
    value_00.m_max = local_240.super_ConstValueRangeAccess.m_max;
    VariableManager::setValue(pVVar2,pVVar4,value_00);
    ValueRange::~ValueRange((ValueRange *)local_1f8);
  }
  else {
    pVVar2 = GeneratorState::getVariableManager
                       ((GeneratorState *)
                        first.
                        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableSupersetEntry>
                        .m_filter.m_valueRange.m_max);
    pVVar4 = (this->super_VariableAccess).m_variable;
    ValueEntry::getValueRange
              ((ConstValueRangeAccess *)
               &infRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,pVVar6);
    value.m_min = (Scalar *)uStack_170;
    value.m_type = (VariableType *)
                   infRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    value.m_max = local_168;
    VariableManager::setValue(pVVar2,pVVar4,value);
  }
  return;
}

Assistant:

VariableWrite::VariableWrite (GeneratorState& state, ConstValueRangeAccess valueRange)
{
	DE_ASSERT(!valueRange.getType().isVoid());

	// Find variable with range that is superset of given range
	IsWritableSupersetEntry::Iterator	first	= state.getVariableManager().getBegin(IsWritableSupersetEntry(valueRange));
	IsWritableSupersetEntry::Iterator	end		= state.getVariableManager().getEnd(IsWritableSupersetEntry(valueRange));

	const float	createOnAssignWeight	= 0.1f; // Will essentially create an unused variable
	bool		createVar				= canAllocateVariable(state, valueRange.getType()) && (first == end || getWeightedBool(state.getRandom(), createOnAssignWeight));

	if (createVar)
	{
		m_variable = state.getVariableManager().allocate(valueRange.getType());
		// \note Storage will be LOCAL
	}
	else
	{
		// Choose random
		DE_ASSERT(first != end);
		const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(first, end);
		m_variable = entry->getVariable();
	}

	DE_ASSERT(m_variable);

	// Reset value range.
	const ValueEntry* parentEntry = state.getVariableManager().getParentValue(m_variable);
	if (parentEntry)
	{
		// Use parent value range.
		state.getVariableManager().setValue(m_variable, parentEntry->getValueRange());
	}
	else
	{
		// Use infinite range.
		ValueRange infRange(m_variable->getType());
		setInfiniteRange(infRange);

		state.getVariableManager().setValue(m_variable, infRange.asAccess());
	}
}